

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O3

bool __thiscall
HighsImplications::runProbing(HighsImplications *this,HighsInt col,HighsInt *numReductions)

{
  double *pdVar1;
  pointer *ppHVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  HighsMipSolverData *pHVar6;
  pointer pIVar7;
  HighsMipSolverData *pHVar8;
  iterator __position;
  pointer pHVar9;
  bool bVar10;
  long lVar11;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *pvVar12;
  HighsInt loc;
  pointer pHVar13;
  double dVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  HighsInt implcol;
  HighsSubstitution substitution;
  bool local_a9;
  ulong local_a8;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_a0;
  long local_98;
  double local_90;
  ulong local_88;
  ulong local_80;
  HighsDomain *local_78;
  HighsSubstitution local_70;
  vector<HighsSubstitution,std::allocator<HighsSubstitution>> *local_58;
  double local_50;
  ulong local_48;
  ulong local_40;
  pointer local_38;
  
  pHVar6 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  lVar17 = (long)col;
  if (((((*(char *)(*(long *)&(((pHVar6->domain).mipsolver)->model_->integrality_).
                              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                              _M_impl + lVar17) == '\0') ||
        (dVar14 = *(double *)
                   (*(long *)&(pHVar6->domain).col_lower_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl +
                   lVar17 * 8), dVar14 != 0.0)) || (NAN(dVar14))) ||
      (((dVar14 = *(double *)
                   (*(long *)&(pHVar6->domain).col_upper_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl +
                   lVar17 * 8), dVar14 != 1.0 || (NAN(dVar14))) ||
       ((pIVar7 = (this->implications).
                  super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                  ._M_impl.super__Vector_impl_data._M_start, pIVar7[col * 2 + 1].computed != false
        || (iVar20 = col * 2, pIVar7[iVar20].computed != false)))))) ||
     ((lVar11 = (long)*(int *)(*(long *)&(pHVar6->cliquetable).colsubstituted.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              lVar17 * 4), lVar11 != 0 &&
      (*(long *)&(pHVar6->cliquetable).substitutions.
                 super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                 ._M_impl + lVar11 * 8 != 8)))) {
    bVar10 = false;
  }
  else {
    bVar10 = computeImplications(this,col,true);
    if ((!bVar10) && ((pHVar6->domain).infeasible_ == false)) {
      pHVar8 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      lVar11 = (long)*(int *)(*(long *)&(pHVar8->cliquetable).colsubstituted.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                             lVar17 * 4);
      if (((lVar11 == 0) ||
          (*(long *)&(pHVar8->cliquetable).substitutions.
                     super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                     ._M_impl + lVar11 * 8 == 8)) &&
         ((bVar10 = computeImplications(this,col,false), !bVar10 &&
          ((pHVar6->domain).infeasible_ == false)))) {
        pHVar8 = (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar17 = (long)*(int *)(*(long *)&(pHVar8->cliquetable).colsubstituted.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               lVar17 * 4);
        if ((lVar17 == 0) ||
           (*(long *)&(pHVar8->cliquetable).substitutions.
                      super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                      ._M_impl + lVar17 * 8 == 8)) {
          local_38 = (this->implications).
                     super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_38[iVar20].computed == false) {
            local_a9 = computeImplications(this,col,false);
            local_38 = (this->implications).
                       super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            local_a9 = false;
          }
          pvVar12 = getImplications(this,col,true,&local_a9);
          local_80 = (ulong)((long)(pvVar12->
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar12->
                                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4;
          if ((0 < (int)local_80) &&
             (local_88 = (ulong)((long)*(pointer *)
                                        ((long)&local_38[iVar20].implics.
                                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                                ._M_impl + 8) -
                                *(long *)&local_38[iVar20].implics.
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl) >> 4, 0 < (int)local_88)) {
            local_78 = &pHVar6->domain;
            local_38 = local_38 + iVar20;
            local_58 = (vector<HighsSubstitution,std::allocator<HighsSubstitution>> *)
                       &this->substitutions;
            local_40 = local_88 & 0x7fffffff;
            local_48 = local_80 & 0x7fffffff;
            iVar20 = 0;
            iVar15 = 0;
            local_a0 = pvVar12;
            do {
              lVar19 = (long)iVar20;
              pHVar13 = (pvVar12->
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              dVar14 = (double)(lVar19 * 0x10);
              uVar5 = pHVar13[lVar19].column;
              local_a8 = (ulong)uVar5;
              lVar11 = (long)iVar15;
              lVar17 = *(long *)&(local_38->implics).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl;
              iVar21 = *(int *)(lVar17 + 8 + lVar11 * 0x10);
              if ((int)uVar5 < iVar21) {
                iVar20 = iVar20 + 1;
              }
              else if (iVar21 < (int)uVar5) {
                iVar15 = iVar15 + 1;
              }
              else {
                local_98 = (long)(int)uVar5;
                dVar3 = *(double *)
                         (*(long *)&(pHVar6->domain).col_lower_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         local_98 * 8);
                dVar24 = *(double *)
                          (*(long *)&(pHVar6->domain).col_upper_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          local_98 * 8);
                iVar21 = iVar15 + 1;
                if (iVar15 + 1 <= (int)local_88) {
                  iVar21 = (int)local_88;
                }
                pdVar18 = (double *)(lVar17 + lVar11 * 0x10);
                dVar22 = dVar3;
                dVar26 = dVar24;
                do {
                  lVar11 = lVar11 + 1;
                  dVar4 = *pdVar18;
                  dVar25 = dVar22;
                  local_90 = dVar26;
                  if (*(int *)((long)pdVar18 + 0xc) == 0) {
                    dVar25 = dVar4;
                    if (dVar4 <= dVar22) {
                      dVar25 = dVar22;
                    }
                  }
                  else {
                    local_90 = dVar4;
                    if (dVar26 <= dVar4) {
                      local_90 = dVar26;
                    }
                  }
                  iVar16 = iVar21;
                  if ((long)local_40 <= lVar11) break;
                  iVar15 = iVar15 + 1;
                  pdVar1 = pdVar18 + 3;
                  pdVar18 = pdVar18 + 2;
                  dVar22 = dVar25;
                  dVar26 = local_90;
                  iVar16 = iVar15;
                } while (*(uint *)pdVar1 == uVar5);
                iVar15 = iVar20 + 1;
                if (iVar20 + 1 <= (int)local_80) {
                  iVar15 = (int)local_80;
                }
                pHVar13 = pHVar13 + lVar19;
                dVar22 = dVar3;
                dVar26 = dVar24;
                do {
                  lVar19 = lVar19 + 1;
                  dVar4 = pHVar13->boundval;
                  dVar23 = dVar22;
                  dVar27 = dVar26;
                  if (pHVar13->boundtype == kLower) {
                    dVar23 = dVar4;
                    if (dVar4 <= dVar22) {
                      dVar23 = dVar22;
                    }
                  }
                  else {
                    dVar27 = dVar4;
                    if (dVar26 <= dVar4) {
                      dVar27 = dVar26;
                    }
                  }
                  iVar21 = iVar15;
                  if ((long)local_48 <= lVar19) break;
                  iVar20 = iVar20 + 1;
                  pHVar9 = pHVar13 + 1;
                  pHVar13 = pHVar13 + 1;
                  dVar22 = dVar23;
                  dVar26 = dVar27;
                  iVar21 = iVar20;
                } while (pHVar9->column == uVar5);
                pvVar12 = local_a0;
                iVar20 = iVar21;
                iVar15 = iVar16;
                if ((this->colsubstituted).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[local_98] == '\0') {
                  if ((dVar3 != dVar24) || (NAN(dVar3) || NAN(dVar24))) {
                    if ((dVar25 != local_90) ||
                       ((((NAN(dVar25) || NAN(local_90) || (dVar23 != dVar27)) ||
                         (NAN(dVar23) || NAN(dVar27))) ||
                        (pdVar18 = &((this->mipsolver->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                    _M_head_impl)->feastol,
                        ABS(dVar25 - dVar23) < *pdVar18 || ABS(dVar25 - dVar23) == *pdVar18)))) {
                      if (dVar25 <= dVar23) {
                        dVar23 = dVar25;
                      }
                      dVar22 = local_90;
                      if (dVar3 < dVar23) {
                        boundchg.column = uVar5;
                        boundchg.boundval = dVar23;
                        boundchg.boundtype = kLower;
                        local_50 = dVar27;
                        HighsDomain::changeBound(local_78,boundchg,(Reason)0xfffffffe);
                        *numReductions = *numReductions + 1;
                        dVar24 = *(double *)
                                  (*(long *)&(pHVar6->domain).col_upper_.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl + local_98 * 8);
                        dVar22 = local_90;
                        dVar27 = local_50;
                        dVar14 = local_90;
                      }
                      local_90 = dVar14;
                      if (dVar27 <= dVar22) {
                        dVar27 = dVar22;
                      }
                      pvVar12 = local_a0;
                      if (dVar24 <= dVar27) goto LAB_002a2220;
                      boundchg_00._8_8_ = local_a8 + 0x100000000;
                      boundchg_00.boundval = dVar27;
                      HighsDomain::changeBound(local_78,boundchg_00,(Reason)0xfffffffe);
                    }
                    else {
                      local_70.scale = dVar23 - dVar25;
                      __position._M_current =
                           (this->substitutions).
                           super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_70.substcol = uVar5;
                      local_70.staycol = col;
                      local_70.offset = dVar25;
                      if (__position._M_current ==
                          (this->substitutions).
                          super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        local_90 = dVar14;
                        std::vector<HighsSubstitution,std::allocator<HighsSubstitution>>::
                        _M_realloc_insert<HighsSubstitution_const&>(local_58,__position,&local_70);
                      }
                      else {
                        (__position._M_current)->offset = dVar25;
                        (__position._M_current)->substcol = uVar5;
                        (__position._M_current)->staycol = col;
                        (__position._M_current)->scale = local_70.scale;
                        ppHVar2 = &(this->substitutions).
                                   super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppHVar2 = *ppHVar2 + 1;
                      }
                      (this->colsubstituted).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[local_98] = '\x01';
                    }
                    *numReductions = *numReductions + 1;
                    pvVar12 = local_a0;
                  }
                }
              }
LAB_002a2220:
            } while ((iVar20 < (int)local_80) && (iVar15 < (int)local_88));
          }
        }
      }
    }
    bVar10 = true;
  }
  return bVar10;
}

Assistant:

bool HighsImplications::runProbing(HighsInt col, HighsInt& numReductions) {
  HighsDomain& globaldomain = mipsolver.mipdata_->domain;
  if (globaldomain.isBinary(col) && !implicationsCached(col, 1) &&
      !implicationsCached(col, 0) &&
      mipsolver.mipdata_->cliquetable.getSubstitution(col) == nullptr) {
    bool infeasible;

    infeasible = computeImplications(col, 1);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    infeasible = computeImplications(col, 0);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    // analyze implications
    const std::vector<HighsDomainChange>& implicsdown =
        getImplications(col, 0, infeasible);
    const std::vector<HighsDomainChange>& implicsup =
        getImplications(col, 1, infeasible);
    HighsInt nimplicsdown = implicsdown.size();
    HighsInt nimplicsup = implicsup.size();
    HighsInt u = 0;
    HighsInt d = 0;

    while (u < nimplicsup && d < nimplicsdown) {
      if (implicsup[u].column < implicsdown[d].column)
        ++u;
      else if (implicsdown[d].column < implicsup[u].column)
        ++d;
      else {
        assert(implicsup[u].column == implicsdown[d].column);
        HighsInt implcol = implicsup[u].column;
        double lbDown = globaldomain.col_lower_[implcol];
        double ubDown = globaldomain.col_upper_[implcol];
        double lbUp = lbDown;
        double ubUp = ubDown;

        do {
          if (implicsdown[d].boundtype == HighsBoundType::kLower)
            lbDown = std::max(lbDown, implicsdown[d].boundval);
          else
            ubDown = std::min(ubDown, implicsdown[d].boundval);
          ++d;
        } while (d < nimplicsdown && implicsdown[d].column == implcol);

        do {
          if (implicsup[u].boundtype == HighsBoundType::kLower)
            lbUp = std::max(lbUp, implicsup[u].boundval);
          else
            ubUp = std::min(ubUp, implicsup[u].boundval);
          ++u;
        } while (u < nimplicsup && implicsup[u].column == implcol);

        if (colsubstituted[implcol] || globaldomain.isFixed(implcol)) continue;

        if (lbDown == ubDown && lbUp == ubUp &&
            std::abs(lbDown - lbUp) > mipsolver.mipdata_->feastol) {
          HighsSubstitution substitution;
          substitution.substcol = implcol;
          substitution.staycol = col;
          substitution.offset = lbDown;
          substitution.scale = lbUp - lbDown;
          substitutions.push_back(substitution);
          colsubstituted[implcol] = true;
          ++numReductions;
        } else {
          double lb = std::min(lbDown, lbUp);
          double ub = std::max(ubDown, ubUp);

          if (lb > globaldomain.col_lower_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kLower, implcol, lb,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }

          if (ub < globaldomain.col_upper_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kUpper, implcol, ub,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }
        }
      }
    }

    return true;
  }

  return false;
}